

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

cast_error *
pybind11::cast_error_unable_to_convert_call_arg
          (cast_error *__return_storage_ptr__,string *name,string *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *type_local;
  string *name_local;
  
  local_20 = type;
  type_local = name;
  name_local = (string *)__return_storage_ptr__;
  std::operator+(&local_a0,"Unable to convert call argument \'",name);
  std::operator+(&local_80,&local_a0,"\' of type \'");
  std::operator+(&local_60,&local_80,local_20);
  std::operator+(&local_40,&local_60,"\' to Python object");
  cast_error::runtime_error(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

inline cast_error cast_error_unable_to_convert_call_arg(const std::string &name,
                                                        const std::string &type) {
    return cast_error("Unable to convert call argument '" + name + "' of type '" + type
                      + "' to Python object");
}